

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall
leveldb::log::_Test_TruncatedTrailingRecordIsIgnored::_Run
          (_Test_TruncatedTrailingRecordIsIgnored *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string local_1e8;
  int local_1c4;
  undefined1 local_1c0 [24];
  stringstream local_1a8 [392];
  
  local_1c0._0_8_ = local_1c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"foo","");
  LogTest::Write(&this->super_LogTest,(string *)local_1c0);
  if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_);
  }
  std::__cxx11::string::resize
            ((ulong)&(this->super_LogTest).dest_.contents_,
             (char)(this->super_LogTest).dest_.contents_._M_string_length + -4);
  local_1c0[0] = (string)0x1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x183;
  std::__cxx11::stringstream::stringstream(local_1a8);
  LogTest::Read_abi_cxx11_(&local_1e8,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [4])"EOF",&local_1e8);
  paVar1 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  local_1c0[0] = (string)0x1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x185;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1c4 = 0;
  local_1e8._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
  test::Tester::IsEq<int,unsigned_long>((Tester *)local_1c0,&local_1c4,(unsigned_long *)&local_1e8);
  test::Tester::~Tester((Tester *)local_1c0);
  local_1c0[0] = (string)0x1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x186;
  std::__cxx11::stringstream::stringstream(local_1a8);
  pcVar2 = (this->super_LogTest).report_.message_._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,
             pcVar2 + (this->super_LogTest).report_.message_._M_string_length);
  test::Tester::IsEq<char[1],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [1])0x10f022,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  return;
}

Assistant:

TEST(LogTest, TruncatedTrailingRecordIsIgnored) {
  Write("foo");
  ShrinkSize(4);  // Drop all payload as well as a header byte
  ASSERT_EQ("EOF", Read());
  // Truncated last record is ignored, not treated as an error.
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}